

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O2

bool __thiscall Json::Reader::readValue(Reader *this)

{
  bool bVar1;
  _Elt_pointer ppVVar2;
  Token *token_00;
  Token token;
  allocator local_49;
  ValueHolder local_48;
  undefined2 local_40;
  Token local_28;
  
  token_00 = &local_28;
  skipCommentTokens(this,token_00);
  switch(local_28.type_) {
  case tokenObjectBegin:
    bVar1 = readObject(this,token_00);
    return bVar1;
  default:
    std::__cxx11::string::string
              ((string *)&local_48.bool_,"Syntax error: value, object or array expected.",&local_49)
    ;
    addError(this,(string *)&local_48,&local_28,(Location)0x0);
    std::__cxx11::string::~string((string *)&local_48.bool_);
    bVar1 = false;
    break;
  case tokenArrayBegin:
    bVar1 = readArray(this,token_00);
    return bVar1;
  case tokenString:
    bVar1 = decodeString(this,&local_28);
    break;
  case tokenInteger:
    bVar1 = decodeNumber(this,&local_28);
    break;
  case tokenDouble:
    bVar1 = decodeDouble(this,&local_28);
    break;
  case tokenTrue:
    local_40 = 5;
    local_48.bool_ = true;
    goto LAB_001e5d45;
  case tokenFalse:
    local_40 = 5;
    local_48.bool_ = false;
    goto LAB_001e5d45;
  case tokenNull:
    local_40 = 0;
LAB_001e5d45:
    ppVVar2 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar2 ==
        (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      ppVVar2 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    Value::swap(ppVVar2[-1],(Value *)&local_48);
    Value::~Value((Value *)&local_48);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool
Reader::readValue ()
{
    Token token;
    skipCommentTokens ( token );
    bool successful = true;

    switch ( token.type_ )
    {
    case tokenObjectBegin:
        successful = readObject ( token );
        break;

    case tokenArrayBegin:
        successful = readArray ( token );
        break;

    case tokenInteger:
        successful = decodeNumber ( token );
        break;

    case tokenDouble:
        successful = decodeDouble ( token );
        break;

    case tokenString:
        successful = decodeString ( token );
        break;

    case tokenTrue:
        currentValue () = true;
        break;

    case tokenFalse:
        currentValue () = false;
        break;

    case tokenNull:
        currentValue () = Value ();
        break;

    default:
        return addError ( "Syntax error: value, object or array expected.", token );
    }

    return successful;
}